

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<Js::FrameDisplay*>
          (BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,FrameDisplay **key,void **value)

{
  int iVar1;
  void **ppvVar2;
  int i;
  void **value_local;
  FrameDisplay **key_local;
  BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar1 = FindEntryWithKey<Js::FrameDisplay*>(this,key);
  if (-1 < iVar1) {
    ppvVar2 = anon_unknown_6::
              ValueEntry<void_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_void_*>_>
              ::Value((ValueEntry<void_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_void_*>_>
                       *)(*(long *)(this + 8) + (long)iVar1 * 0x18));
    *value = *ppvVar2;
  }
  return -1 < iVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }